

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall
CCheckQueueControl<UniqueCheck>::~CCheckQueueControl(CCheckQueueControl<UniqueCheck> *this)

{
  long in_FS_OFFSET;
  string lockname;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fDone == false) {
    Wait(this);
  }
  if (this->pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
    local_30 = local_20;
    local_28 = 0;
    local_20[0] = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->pqueue->m_control_mutex);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueueControl()
    {
        if (!fDone)
            Wait();
        if (pqueue != nullptr) {
            LEAVE_CRITICAL_SECTION(pqueue->m_control_mutex);
        }
    }